

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3FixSelect(DbFixer *pFix,Select *pSelect)

{
  long lVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  
  while( true ) {
    if (pSelect == (Select *)0x0) {
      return 0;
    }
    iVar2 = sqlite3FixExprList(pFix,pSelect->pEList);
    if (iVar2 != 0) {
      return 1;
    }
    iVar2 = sqlite3FixSrcList(pFix,pSelect->pSrc);
    if (iVar2 != 0) {
      return 1;
    }
    iVar2 = sqlite3FixExpr(pFix,pSelect->pWhere);
    if (iVar2 != 0) {
      return 1;
    }
    iVar2 = sqlite3FixExprList(pFix,pSelect->pGroupBy);
    if (iVar2 != 0) {
      return 1;
    }
    iVar2 = sqlite3FixExpr(pFix,pSelect->pHaving);
    if (iVar2 != 0) {
      return 1;
    }
    iVar2 = sqlite3FixExprList(pFix,pSelect->pOrderBy);
    if (iVar2 != 0) {
      return 1;
    }
    iVar2 = sqlite3FixExpr(pFix,pSelect->pLimit);
    if (iVar2 != 0) break;
    if (pSelect->pWith != (With *)0x0) {
      lVar4 = 0x20;
      lVar3 = -1;
      while( true ) {
        lVar3 = lVar3 + 1;
        if (pSelect->pWith->nCte <= lVar3) break;
        lVar1 = lVar4 + -0x10;
        lVar4 = lVar4 + 0x20;
        iVar2 = sqlite3FixSelect(pFix,*(Select **)((long)pSelect->pWith->a + lVar1));
        if (iVar2 != 0) {
          return 1;
        }
      }
    }
    pSelect = pSelect->pPrior;
  }
  return 1;
}

Assistant:

SQLITE_PRIVATE int sqlite3FixSelect(
  DbFixer *pFix,       /* Context of the fixation */
  Select *pSelect      /* The SELECT statement to be fixed to one database */
){
  while( pSelect ){
    if( sqlite3FixExprList(pFix, pSelect->pEList) ){
      return 1;
    }
    if( sqlite3FixSrcList(pFix, pSelect->pSrc) ){
      return 1;
    }
    if( sqlite3FixExpr(pFix, pSelect->pWhere) ){
      return 1;
    }
    if( sqlite3FixExprList(pFix, pSelect->pGroupBy) ){
      return 1;
    }
    if( sqlite3FixExpr(pFix, pSelect->pHaving) ){
      return 1;
    }
    if( sqlite3FixExprList(pFix, pSelect->pOrderBy) ){
      return 1;
    }
    if( sqlite3FixExpr(pFix, pSelect->pLimit) ){
      return 1;
    }
    if( pSelect->pWith ){
      int i;
      for(i=0; i<pSelect->pWith->nCte; i++){
        if( sqlite3FixSelect(pFix, pSelect->pWith->a[i].pSelect) ){
          return 1;
        }
      }
    }
    pSelect = pSelect->pPrior;
  }
  return 0;
}